

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

uint32_t lyht_hash_multi(uint32_t hash,char *key_part,size_t len)

{
  uint uVar1;
  uint uVar2;
  
  if (len == 0 || key_part == (char *)0x0) {
    hash = (hash * 9 >> 0xb ^ hash * 9) * 0x8001;
  }
  else {
    uVar1 = 0;
    while( true ) {
      if (len <= uVar1) break;
      uVar2 = (hash + (int)key_part[uVar1]) * 0x401;
      hash = uVar2 >> 6 ^ uVar2;
      uVar1 = uVar1 + 1;
    }
  }
  return hash;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyht_hash_multi(uint32_t hash, const char *key_part, size_t len)
{
    uint32_t i;

    if (key_part && len) {
        for (i = 0; i < len; ++i) {
            hash += key_part[i];
            hash += (hash << 10);
            hash ^= (hash >> 6);
        }
    } else {
        hash += (hash << 3);
        hash ^= (hash >> 11);
        hash += (hash << 15);
    }

    return hash;
}